

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestOneof2_NestedMessage::_InternalSerialize
          (TestOneof2_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  int iVar2;
  int *piVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.moo_int_,target);
  }
  uVar9 = *(uint *)((long)&this->field_0 + 0x18);
  if (0 < (int)uVar9) {
    pbVar5 = stream->end_;
    if (pbVar5 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar5 = stream->end_;
    }
    if (pbVar5 <= target) {
      _InternalSerialize();
    }
    this_00 = &(this->field_0)._impl_.corge_int_;
    *target = 0x12;
    pbVar5 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar5;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = target + 1;
        bVar10 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar10);
    }
    *pbVar5 = (byte)uVar9;
    if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      piVar3 = (int *)((long)&this->field_0 + 0x10);
      bVar10 = true;
    }
    else {
      piVar3 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
      bVar10 = (undefined1  [16])
               ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
               (undefined1  [16])0x0;
    }
    target = target + 2;
    iVar2 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar10);
    piVar1 = piVar3 + iVar2;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = (ulong)*piVar3;
      uVar7 = uVar6;
      if (0x7f < uVar6) {
        do {
          *target = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          target = target + 1;
          bVar10 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar10);
      }
      piVar3 = piVar3 + 1;
      *target = (byte)uVar6;
      target = target + 1;
    } while (piVar3 < piVar1);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneof2_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestOneof2.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 moo_int = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_moo_int(), target);
  }

  // repeated int32 corge_int = 2;
  {
    int byte_size = this_._impl_._corge_int_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_corge_int(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestOneof2.NestedMessage)
  return target;
}